

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O2

int __thiscall DIS::ResupplyReceivedPdu::getMarshalledSize(ResupplyReceivedPdu *this)

{
  pointer pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  SupplyQuantity listElement;
  
  iVar2 = LogisticsFamilyPdu::getMarshalledSize(&this->super_LogisticsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_receivingEntityID);
  iVar4 = EntityID::getMarshalledSize(&this->_supplyingEntityID);
  iVar2 = iVar4 + iVar3 + iVar2 + 4;
  lVar6 = 0x18;
  for (uVar5 = 0;
      pSVar1 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_supplies).
                            super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5);
      uVar5 = uVar5 + 1) {
    listElement._vptr_SupplyQuantity = (_func_int **)&PTR__SupplyQuantity_001b24d0;
    listElement._supplyType._vptr_EntityType = (_func_int **)&PTR__EntityType_001b0e40;
    listElement._supplyType._8_8_ = *(undefined8 *)((long)pSVar1 + lVar6 + -8);
    listElement._quantity = *(uchar *)((long)&pSVar1->_vptr_SupplyQuantity + lVar6);
    iVar3 = SupplyQuantity::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    SupplyQuantity::~SupplyQuantity(&listElement);
    lVar6 = lVar6 + 0x20;
  }
  return iVar2;
}

Assistant:

int ResupplyReceivedPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = LogisticsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _receivingEntityID.getMarshalledSize();  // _receivingEntityID
   marshalSize = marshalSize + _supplyingEntityID.getMarshalledSize();  // _supplyingEntityID
   marshalSize = marshalSize + 1;  // _numberOfSupplyTypes
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 1;  // _padding2

   for(unsigned long long idx=0; idx < _supplies.size(); idx++)
   {
        SupplyQuantity listElement = _supplies[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}